

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

void adt_hnode_destroy(adt_hnode_t *node,_func_void_void_ptr *pDestructor)

{
  adt_hkey_tag *paVar1;
  byte local_31;
  uint8_t i_1;
  adt_hkey_t *next;
  adt_hkey_t *hkey;
  int i;
  _func_void_void_ptr *pDestructor_local;
  adt_hnode_t *node_local;
  
  if (node->u8Width < 0x10) {
    for (hkey._4_4_ = 0; hkey._4_4_ < (int)(uint)node->u8Cur; hkey._4_4_ = hkey._4_4_ + 1) {
      next = (node->child).match[hkey._4_4_].key;
      while (next != (adt_hkey_t *)0x0) {
        paVar1 = next->next;
        adt_hkey_delete(next,pDestructor);
        next = paVar1;
      }
    }
    free((node->child).match);
  }
  else {
    if (node->u8Width != '\x10') {
      __assert_fail("node->u8Width==16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,300,"void adt_hnode_destroy(adt_hnode_t *, void (*)(void *))");
    }
    for (local_31 = 0; local_31 < 0x10; local_31 = local_31 + 1) {
      adt_hnode_destroy((adt_hnode_t *)((node->child).match + local_31),pDestructor);
    }
    free((node->child).match);
  }
  return;
}

Assistant:

void adt_hnode_destroy(adt_hnode_t *node,void (*pDestructor)(void*)){
	if(node->u8Width<16){
		int i;
		for(i=0;i<node->u8Cur;i++){
			adt_hkey_t *hkey = node->child.match[i].key;
			while( hkey ){
				adt_hkey_t *next = hkey->next;
				adt_hkey_delete(hkey,pDestructor);
				hkey = next;
			}
		}
		free(node->child.match);
	}
	else{
      uint8_t i;
      assert(node->u8Width==16);
		for(i=0;i<16;i++){
			adt_hnode_destroy(&node->child.node[i],pDestructor);
		}
		free(node->child.node);
	}
}